

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitRefEq(FunctionValidator *this,RefEq *curr)

{
  bool result;
  Module *pMVar1;
  HeapType local_28;
  Type local_20;
  Type eqref;
  RefEq *curr_local;
  FunctionValidator *this_local;
  
  eqref.id = (uintptr_t)curr;
  HeapType::HeapType(&local_28,eq);
  wasm::Type::Type(&local_20,local_28,Nullable);
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasGC(&pMVar1->features);
  shouldBeTrue<wasm::RefEq*>(this,result,(RefEq *)eqref.id,"ref.eq requires gc [--enable-gc]");
  shouldBeSubType(this,(Type)*(uintptr_t *)(*(long *)(eqref.id + 0x10) + 8),local_20,
                  *(Expression **)(eqref.id + 0x10),
                  "ref.eq\'s left argument should be a subtype of eqref");
  shouldBeSubType(this,(Type)*(uintptr_t *)(*(long *)(eqref.id + 0x18) + 8),local_20,
                  *(Expression **)(eqref.id + 0x18),
                  "ref.eq\'s right argument should be a subtype of eqref");
  return;
}

Assistant:

void FunctionValidator::visitRefEq(RefEq* curr) {
  Type eqref = Type(HeapType::eq, Nullable);
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "ref.eq requires gc [--enable-gc]");
  shouldBeSubType(curr->left->type,
                  eqref,
                  curr->left,
                  "ref.eq's left argument should be a subtype of eqref");
  shouldBeSubType(curr->right->type,
                  eqref,
                  curr->right,
                  "ref.eq's right argument should be a subtype of eqref");
}